

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeNew(ExpressionContext *ctx,SynNew *syntax)

{
  IntrusiveList<SynCallArgument> *this;
  SynCallArgument *pSVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  long lVar4;
  Allocator *pAVar5;
  FunctionData *function_00;
  ArrayView<ArgumentData> arguments;
  bool bVar6;
  int iVar7;
  uint uVar8;
  TypeBase *pTVar9;
  SynBase *pSVar10;
  ExprBase *pEVar11;
  ExprSequence *this_00;
  VariableData *pVVar12;
  undefined4 extraout_var;
  _func_int **pp_Var13;
  ExprBase *third;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ExprBase *pEVar14;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ExprBase **ppEVar15;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  SynTypeReference *this_01;
  char *pcVar16;
  uint uVar17;
  SynBase **ppSVar18;
  SynArrayIndex *arrayIndex;
  InplaceStr name;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  ArrayView<ExprBase_*> arr_01;
  ExprBase *function;
  TypeBase *local_b40;
  VariableData *local_b38;
  ExprBase *call;
  uint local_b28;
  uint uStack_b24;
  undefined1 local_b20 [32];
  ExprBase *call_1;
  TypedFunctionInstanceRequest request;
  ExprBase *definition_2;
  ExprBase **local_ad8;
  uint uStack_ad0;
  undefined4 uStack_acc;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  ExprBase *local_a80;
  SmallArray<FunctionData_*,_32U> functions;
  SmallArray<ExprBase_*,_3U> expressions;
  ExprBase *definition;
  uint local_340;
  uint uStack_33c;
  ExprBase local_338 [16];
  Allocator *local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_13;
  
  pTVar9 = AnalyzeType(ctx,syntax->type,false,(bool *)0x0);
  if (pTVar9 == (TypeBase *)0x0) {
    if (syntax->count == (SynBase *)0x0) {
      pSVar10 = syntax->type;
      if (pSVar10 != (SynBase *)0x0) {
        if (pSVar10->typeID == 0x19) {
          uVar8 = IntrusiveList<SynCallArgument>::size
                            ((IntrusiveList<SynCallArgument> *)&pSVar10[1].typeID);
          if ((uVar8 == 1) && (lVar4 = *(long *)&pSVar10[1].typeID, *(long *)(lVar4 + 0x40) == 0)) {
            syntax->count = *(SynBase **)(lVar4 + 0x48);
            pSVar10 = (SynBase *)pSVar10[1]._vptr_SynBase;
            syntax->type = pSVar10;
            pTVar9 = AnalyzeType(ctx,pSVar10,false,(bool *)0x0);
            if (pTVar9 != (TypeBase *)0x0) goto LAB_001d4b13;
          }
        }
        goto LAB_001d4ae6;
      }
      pSVar10 = (SynBase *)0x0;
    }
    else {
LAB_001d4ae6:
      pSVar10 = syntax->type;
    }
    if ((syntax->arguments).head == (SynCallArgument *)0x0) {
      if (pSVar10 == (SynBase *)0x0) {
        pSVar10 = (SynBase *)0x0;
      }
      else if (pSVar10->typeID == 0xb) {
        ppSVar18 = (SynBase **)&pSVar10[1].typeID;
        while( true ) {
          pSVar2 = *ppSVar18;
          pAVar5 = ctx->allocator;
          if (pSVar2 == (SynBase *)0x0) break;
          iVar7 = (*pAVar5->_vptr_Allocator[2])(pAVar5,0x50);
          SynCallArgument::SynCallArgument
                    ((SynCallArgument *)CONCAT44(extraout_var_08,iVar7),pSVar2->begin,pSVar2->end,
                     (SynIdentifier *)0x0,pSVar2);
          IntrusiveList<SynCallArgument>::push_back
                    (&syntax->arguments,(SynCallArgument *)CONCAT44(extraout_var_08,iVar7));
          ppSVar18 = &pSVar2->next;
        }
        iVar7 = (*pAVar5->_vptr_Allocator[2])(pAVar5,0x48);
        this_01 = (SynTypeReference *)CONCAT44(extraout_var_13,iVar7);
        SynTypeReference::SynTypeReference
                  (this_01,pSVar10->begin,pSVar10->end,(SynBase *)pSVar10[1]._vptr_SynBase);
        syntax->type = (SynBase *)this_01;
        pTVar9 = AnalyzeType(ctx,(SynBase *)this_01,false,(bool *)0x0);
        if (pTVar9 != (TypeBase *)0x0) goto LAB_001d4b13;
        pSVar10 = syntax->type;
      }
    }
    AnalyzeType(ctx,pSVar10,true,(bool *)0x0);
    pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  }
LAB_001d4b13:
  if (pTVar9->isGeneric == true) {
    anon_unknown.dwarf_ff84f::Stop(ctx,syntax->type,"ERROR: generic type is not allowed");
  }
  if ((pTVar9 == ctx->typeVoid) || (pTVar9 == ctx->typeAuto)) {
    pSVar10 = syntax->type;
    uVar8 = *(int *)&(pTVar9->name).end - (int)(pTVar9->name).begin;
    pcVar16 = "ERROR: can\'t allocate objects of type \'%.*s\'";
  }
  else {
    if ((pTVar9->typeID != 0x18) || (*(char *)&pTVar9[3]._vptr_TypeBase != '\0')) {
      pSVar10 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      if (syntax->count == (SynBase *)0x0) {
        this_00 = (ExprSequence *)CreateObjectAllocation(ctx,&syntax->super_SynBase,pTVar9);
        local_b40 = (this_00->super_ExprBase).type;
        if ((local_b40 == (TypeBase *)0x0) || (local_b40->typeID != 0x12)) {
          local_b40 = (TypeBase *)0x0;
        }
        pTVar9 = (TypeBase *)local_b40[1]._vptr_TypeBase;
        functions.allocator = ctx->allocator;
        functions.data = functions.little;
        functions.count = 0;
        functions.max = 0x20;
        bVar6 = GetTypeConstructorFunctions
                          (ctx,pTVar9,(syntax->arguments).head == (SynCallArgument *)0x0,&functions)
        ;
        if (bVar6) {
          pVVar12 = anon_unknown.dwarf_ff84f::AllocateTemporary
                              (ctx,&syntax->super_SynBase,(this_00->super_ExprBase).type);
          pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar12,false);
          pEVar11 = CreateAssignment(ctx,pSVar10,pEVar11,(ExprBase *)this_00);
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar14 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
          pTVar3 = ctx->typeVoid;
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var13 = (_func_int **)CONCAT44(extraout_var_02,iVar7);
          *pp_Var13 = (_func_int *)0x0;
          pp_Var13[1] = (_func_int *)pVVar12;
          pp_Var13[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var13 + 3) = 0;
          pEVar14->typeID = 0x1e;
          pEVar14->source = pSVar10;
          pEVar14->type = pTVar3;
          pEVar14->next = (ExprBase *)0x0;
          pEVar14->listed = false;
          pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
          pEVar14[1]._vptr_ExprBase = pp_Var13;
          *(ExprBase **)&pEVar14[1].typeID = pEVar11;
          functions_00.count = functions.count;
          functions_00.data = functions.data;
          definition = pEVar14;
          pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar12,false);
          functions_00._12_4_ = 0;
          pEVar11 = CreateConstructorAccess(ctx,&syntax->super_SynBase,functions_00,pEVar11);
          pSVar1 = (syntax->arguments).head;
          call = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar11,
                                    (IntrusiveList<TypeHandle>)ZEXT816(0),pSVar1,
                                    pSVar1 == (SynCallArgument *)0x0);
          if (call != (ExprBase *)0x0) {
            expressions.allocator = ctx->allocator;
            expressions.data = expressions.little;
            expressions.count = 0;
            expressions.max = 3;
            SmallArray<ExprBase_*,_3U>::push_back(&expressions,&definition);
            SmallArray<ExprBase_*,_3U>::push_back(&expressions,&call);
            request._0_8_ = CreateVariableAccess(ctx,pSVar10,pVVar12,false);
            SmallArray<ExprBase_*,_3U>::push_back(&expressions,(ExprBase **)&request);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
            this_00 = (ExprSequence *)CONCAT44(extraout_var_03,iVar7);
            arr.count = expressions.count;
            arr.data = expressions.data;
            arr._12_4_ = 0;
            ExprSequence::ExprSequence(this_00,ctx->allocator,&syntax->super_SynBase,local_b40,arr);
            SmallArray<ExprBase_*,_3U>::~SmallArray(&expressions);
          }
        }
        else {
          this = &syntax->arguments;
          uVar8 = IntrusiveList<SynCallArgument>::size(this);
          if (uVar8 == 1) {
            if (this->head->name != (SynIdentifier *)0x0) {
LAB_001d5736:
              pcVar16 = (pTVar9->name).begin;
              iVar7 = (int)pcVar16;
              uVar17 = *(int *)&(pTVar9->name).end - iVar7;
              uVar8 = IntrusiveList<SynCallArgument>::size(this);
              anon_unknown.dwarf_ff84f::Stop
                        (ctx,&syntax->super_SynBase,
                         "ERROR: function \'%.*s::%.*s\' that accepts %d arguments is undefined",
                         (ulong)uVar17,pcVar16,(ulong)uVar17,iVar7,uVar8);
            }
            pVVar12 = anon_unknown.dwarf_ff84f::AllocateTemporary
                                (ctx,&syntax->super_SynBase,(this_00->super_ExprBase).type);
            pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar12,false);
            pEVar11 = CreateAssignment(ctx,pSVar10,pEVar11,(ExprBase *)this_00);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar14 = (ExprBase *)CONCAT44(extraout_var_04,iVar7);
            pTVar3 = ctx->typeVoid;
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var13 = (_func_int **)CONCAT44(extraout_var_05,iVar7);
            *pp_Var13 = (_func_int *)0x0;
            pp_Var13[1] = (_func_int *)pVVar12;
            pp_Var13[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var13 + 3) = 0;
            pEVar14->typeID = 0x1e;
            pEVar14->source = pSVar10;
            pEVar14->type = pTVar3;
            pEVar14->next = (ExprBase *)0x0;
            pEVar14->listed = false;
            pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
            pEVar14[1]._vptr_ExprBase = pp_Var13;
            *(ExprBase **)&pEVar14[1].typeID = pEVar11;
            definition = pEVar14;
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar11 = (ExprBase *)CONCAT44(extraout_var_06,iVar7);
            pEVar14 = CreateVariableAccess(ctx,pSVar10,pVVar12,false);
            pEVar11->typeID = 0x16;
            pEVar11->source = &syntax->super_SynBase;
            pEVar11->type = pTVar9;
            pEVar11->next = (ExprBase *)0x0;
            pEVar11->listed = false;
            pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3520;
            pEVar11[1]._vptr_ExprBase = (_func_int **)pEVar14;
            pEVar14 = AnalyzeExpression(ctx,((syntax->arguments).head)->value);
            call = CreateAssignment(ctx,&syntax->super_SynBase,pEVar11,pEVar14);
            expressions.allocator = ctx->allocator;
            expressions.data = expressions.little;
            expressions.count = 0;
            expressions.max = 3;
            SmallArray<ExprBase_*,_3U>::push_back(&expressions,&definition);
            SmallArray<ExprBase_*,_3U>::push_back(&expressions,&call);
            request._0_8_ = CreateVariableAccess(ctx,pSVar10,pVVar12,false);
            SmallArray<ExprBase_*,_3U>::push_back(&expressions,(ExprBase **)&request);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
            this_00 = (ExprSequence *)CONCAT44(extraout_var_07,iVar7);
            arr_00.count = expressions.count;
            arr_00.data = expressions.data;
            arr_00._12_4_ = 0;
            ExprSequence::ExprSequence
                      (this_00,ctx->allocator,&syntax->super_SynBase,local_b40,arr_00);
            SmallArray<ExprBase_*,_3U>::~SmallArray(&expressions);
          }
          else if (this->head != (SynCallArgument *)0x0) goto LAB_001d5736;
        }
        if ((syntax->constructor).head != (SynBase *)0x0) {
          local_b38 = anon_unknown.dwarf_ff84f::AllocateTemporary
                                (ctx,&syntax->super_SynBase,(this_00->super_ExprBase).type);
          pEVar11 = CreateVariableAccess(ctx,pSVar10,local_b38,false);
          pEVar11 = CreateAssignment(ctx,pSVar10,pEVar11,&this_00->super_ExprBase);
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar14 = (ExprBase *)CONCAT44(extraout_var_09,iVar7);
          pTVar3 = ctx->typeVoid;
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var13 = (_func_int **)CONCAT44(extraout_var_10,iVar7);
          *pp_Var13 = (_func_int *)0x0;
          pp_Var13[1] = (_func_int *)local_b38;
          pp_Var13[2] = (_func_int *)0x0;
          iVar7 = 0;
          *(undefined1 *)(pp_Var13 + 3) = 0;
          pEVar14->typeID = 0x1e;
          pEVar14->source = pSVar10;
          pEVar14->type = pTVar3;
          pEVar14->next = (ExprBase *)0x0;
          pEVar14->listed = false;
          pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
          pEVar14[1]._vptr_ExprBase = pp_Var13;
          *(ExprBase **)&pEVar14[1].typeID = pEVar11;
          if (pTVar9 != (TypeBase *)0x0) {
            iVar7 = pTVar9->nameHash * 0x21;
          }
          request.hash = (int)((ulong)syntax >> 0x10) + (int)syntax + iVar7;
          function = (ExprBase *)0x0;
          request.instanceType = pTVar9;
          request.syntax = &syntax->super_SynBase;
          definition_2 = pEVar14;
          ppEVar15 = SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
                     ::find(&ctx->newConstructorFunctions,&request);
          if ((ppEVar15 == (ExprBase **)0x0) || (function = *ppEVar15, function == (ExprBase *)0x0))
          {
            name = GetTemporaryFunctionName(ctx);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_11,iVar7),name);
            local_a98 = 0;
            uStack_a90 = 0;
            local_aa8 = 0;
            uStack_aa0 = 0;
            local_ab8 = 0;
            uStack_ab0 = 0;
            function = CreateFunctionDefinition
                                 (ctx,&syntax->super_SynBase,false,false,pTVar9,false,ctx->typeVoid,
                                  false,(SynIdentifier *)CONCAT44(extraout_var_11,iVar7),
                                  (IntrusiveList<SynIdentifier>)ZEXT816(0),
                                  (IntrusiveList<SynFunctionArgument>)ZEXT816(0),syntax->constructor
                                  ,(FunctionData *)0x0,(TypeFunction *)0x0,
                                  (IntrusiveList<MatchData>)ZEXT816(0));
            SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
            ::insert(&ctx->newConstructorFunctions,&request,&function);
          }
          pEVar11 = function;
          pAVar5 = ctx->allocator;
          memset(local_338,0,0x300);
          local_340 = 0;
          uStack_33c = 0x20;
          function_00 = (FunctionData *)pEVar11[1]._vptr_ExprBase;
          definition = local_338;
          local_38 = pAVar5;
          pEVar11 = CreateVariableAccess(ctx,pSVar10,local_b38,false);
          FunctionValue::FunctionValue
                    ((FunctionValue *)&expressions,&syntax->super_SynBase,function_00,pEVar11);
          SmallArray<FunctionValue,_32U>::push_back
                    ((SmallArray<FunctionValue,_32U> *)&definition,(FunctionValue *)&expressions);
          SmallArray<ArgumentData,_32U>::SmallArray
                    ((SmallArray<ArgumentData,_32U> *)&expressions,ctx->allocator);
          functions_01.count = local_340;
          functions_01.data = (FunctionValue *)definition;
          local_ac8 = 0;
          uStack_ac0 = 0;
          local_ad8 = expressions.data;
          uStack_ad0 = expressions.count;
          arguments._12_4_ = uStack_acc;
          arguments.count = expressions.count;
          arguments.data = (ArgumentData *)expressions.data;
          functions_01._12_4_ = 0;
          call_1 = CreateFunctionCallFinal
                             (ctx,&syntax->super_SynBase,function,functions_01,
                              (IntrusiveList<TypeHandle>)ZEXT816(0),arguments,false);
          local_b20._24_8_ = ctx->allocator;
          call = (ExprBase *)local_b20;
          local_b28 = 0;
          uStack_b24 = 3;
          SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)&call,&definition_2);
          SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)&call,&call_1);
          local_a80 = CreateVariableAccess(ctx,pSVar10,local_b38,false);
          SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)&call,&local_a80);
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          this_00 = (ExprSequence *)CONCAT44(extraout_var_12,iVar7);
          arr_01.count = local_b28;
          arr_01.data = (ExprBase **)call;
          arr_01._12_4_ = 0;
          ExprSequence::ExprSequence(this_00,ctx->allocator,&syntax->super_SynBase,local_b40,arr_01)
          ;
          SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)&call);
          SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&expressions);
          SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)&definition)
          ;
        }
        SmallArray<FunctionData_*,_32U>::~SmallArray(&functions);
      }
      else {
        pSVar1 = (syntax->arguments).head;
        if (pSVar1 != (SynCallArgument *)0x0) {
          anon_unknown.dwarf_ff84f::Report
                    (ctx,&pSVar1->super_SynBase,
                     "ERROR: can\'t provide constructor arguments to array allocation");
        }
        pSVar2 = (syntax->constructor).head;
        if (pSVar2 != (SynBase *)0x0) {
          anon_unknown.dwarf_ff84f::Report
                    (ctx,pSVar2,
                     "ERROR: can\'t provide custom construction code for array allocation");
        }
        pEVar11 = AnalyzeExpression(ctx,syntax->count);
        this_00 = (ExprSequence *)CreateArrayAllocation(ctx,&syntax->super_SynBase,pTVar9,pEVar11);
        bVar6 = HasDefaultConstructor(ctx,&syntax->super_SynBase,pTVar9);
        if (bVar6) {
          pVVar12 = anon_unknown.dwarf_ff84f::AllocateTemporary
                              (ctx,&syntax->super_SynBase,(this_00->super_ExprBase).type);
          pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar12,false);
          pEVar11 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar11,(ExprBase *)this_00);
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar14 = (ExprBase *)CONCAT44(extraout_var,iVar7);
          pTVar9 = ctx->typeVoid;
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var13 = (_func_int **)CONCAT44(extraout_var_00,iVar7);
          *pp_Var13 = (_func_int *)0x0;
          pp_Var13[1] = (_func_int *)pVVar12;
          pp_Var13[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var13 + 3) = 0;
          pEVar14->typeID = 0x1e;
          pEVar14->source = pSVar10;
          pEVar14->type = pTVar9;
          pEVar14->next = (ExprBase *)0x0;
          pEVar14->listed = false;
          pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
          pEVar14[1]._vptr_ExprBase = pp_Var13;
          *(ExprBase **)&pEVar14[1].typeID = pEVar11;
          pTVar9 = pVVar12->type;
          pEVar11 = CreateVariableAccess(ctx,pSVar10,pVVar12,true);
          pEVar11 = CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar9,pEVar11);
          if (pEVar11 != (ExprBase *)0x0) {
            third = CreateVariableAccess(ctx,pSVar10,pVVar12,true);
            pEVar11 = CreateSequence(ctx,&syntax->super_SynBase,pEVar14,pEVar11,third);
            return pEVar11;
          }
        }
      }
      return &this_00->super_ExprBase;
    }
    pSVar10 = syntax->type;
    uVar8 = *(int *)&(pTVar9->name).end - (int)(pTVar9->name).begin;
    pcVar16 = "ERROR: type \'%.*s\' is not fully defined";
  }
  anon_unknown.dwarf_ff84f::Stop(ctx,pSVar10,pcVar16,(ulong)uVar8);
}

Assistant:

ExprBase* AnalyzeNew(ExpressionContext &ctx, SynNew *syntax)
{
	TypeBase *type = AnalyzeType(ctx, syntax->type, false);

	// If there is no count and we have an array type that failed, take last extend as the size
	if(!type && !syntax->count && isType<SynArrayIndex>(syntax->type))
	{
		SynArrayIndex *arrayIndex = getType<SynArrayIndex>(syntax->type);

		if(arrayIndex->arguments.size() == 1 && !arrayIndex->arguments.head->name)
		{
			syntax->count = arrayIndex->arguments.head->value;
			syntax->type = arrayIndex->value;

			type = AnalyzeType(ctx, syntax->type, false);
		}
	}

	// If there are no arguments and we have a function type that failed, take the arguments list as constructor arguments
	if(!type && syntax->arguments.empty() && isType<SynTypeFunction>(syntax->type))
	{
		SynTypeFunction *functionType = getType<SynTypeFunction>(syntax->type);

		for(SynBase *curr = functionType->arguments.head; curr; curr = curr->next)
			syntax->arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

		syntax->type = new (ctx.get<SynTypeReference>()) SynTypeReference(functionType->begin, functionType->end, functionType->returnType);

		type = AnalyzeType(ctx, syntax->type, false);
	}

	// Report the original error
	if(!type)
	{
		AnalyzeType(ctx, syntax->type);

		type = ctx.GetErrorType();
	}

	if(type->isGeneric)
		Stop(ctx, syntax->type, "ERROR: generic type is not allowed");

	if(type == ctx.typeVoid || type == ctx.typeAuto)
		Stop(ctx, syntax->type, "ERROR: can't allocate objects of type '%.*s'", FMT_ISTR(type->name));

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(!typeClass->completed)
			Stop(ctx, syntax->type, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));
	}

	SynBase *syntaxInternal = ctx.MakeInternal(syntax);

	if(syntax->count)
	{
		if(!syntax->arguments.empty())
			Report(ctx, syntax->arguments.head, "ERROR: can't provide constructor arguments to array allocation");

		if(!syntax->constructor.empty())
			Report(ctx, syntax->constructor.head, "ERROR: can't provide custom construction code for array allocation");

		ExprBase *count = AnalyzeExpression(ctx, syntax->count);

		ExprBase *alloc = CreateArrayAllocation(ctx, syntax, type, count);

		if(HasDefaultConstructor(ctx, syntax, type))
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

			ExprBase *initializer = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

			if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateVariableAccess(ctx, syntaxInternal, variable, true)))
				return CreateSequence(ctx, syntax, definition, call, CreateVariableAccess(ctx, syntaxInternal, variable, true));
		}

		return alloc;
	}

	ExprBase *alloc = CreateObjectAllocation(ctx, syntax, type);

	// Call constructor
	TypeRef *allocType = getType<TypeRef>(alloc->type);

	TypeBase *parentType = allocType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, parentType, syntax->arguments.empty(), functions))
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *overloads = CreateConstructorAccess(ctx, syntax, functions, CreateVariableAccess(ctx, syntaxInternal, variable, false));

		if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, IntrusiveList<TypeHandle>(), syntax->arguments.head, syntax->arguments.empty()))
		{
			SmallArray<ExprBase*, 3> expressions(ctx.allocator);

			expressions.push_back(definition);
			expressions.push_back(call);
			expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

			alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
		}
	}
	else if(syntax->arguments.size() == 1 && !syntax->arguments.head->name)
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *copy = CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, parentType, CreateVariableAccess(ctx, syntaxInternal, variable, false)), AnalyzeExpression(ctx, syntax->arguments.head->value));

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(copy);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}
	else if(!syntax->arguments.empty())
	{
		Stop(ctx, syntax, "ERROR: function '%.*s::%.*s' that accepts %d arguments is undefined", FMT_ISTR(parentType->name), FMT_ISTR(parentType->name), syntax->arguments.size());
	}

	// Handle custom constructor
	if(!syntax->constructor.empty())
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		TypedFunctionInstanceRequest request(parentType, syntax);

		ExprBase *function = NULL;

		if(ExprBase **it = ctx.newConstructorFunctions.find(request))
			function = *it;

		if(!function)
		{
			// Create a member function with the constructor body
			InplaceStr name = GetTemporaryFunctionName(ctx);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			function = CreateFunctionDefinition(ctx, syntax, false, false, parentType, false, ctx.typeVoid, false, nameIdentifier, IntrusiveList<SynIdentifier>(), IntrusiveList<SynFunctionArgument>(), syntax->constructor, NULL, NULL, IntrusiveList<MatchData>());

			ctx.newConstructorFunctions.insert(request, function);
		}

		ExprFunctionDefinition *functionDefinition = getType<ExprFunctionDefinition>(function);

		// Call this member function
		SmallArray<FunctionValue, 32> functions(ctx.allocator);
		functions.push_back(FunctionValue(syntax, functionDefinition->function, CreateVariableAccess(ctx, syntaxInternal, variable, false)));

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, IntrusiveList<TypeHandle>(), arguments, false);

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(call);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}

	return alloc;
}